

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O2

void __thiscall yamc::fair::recursive_timed_mutex::lock(recursive_timed_mutex *this)

{
  pthread_t pVar1;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_20;
  
  pVar1 = pthread_self();
  std::unique_lock<std::mutex>::unique_lock(&local_20,(mutex_type *)(this + 0x60));
  if (*(pthread_t *)(this + 8) == pVar1) {
    if (*(long *)this == 0) {
      __assert_fail("0 < ncount_",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_mutex.hpp"
                    ,0x147,"void yamc::fair::recursive_timed_mutex::lock()");
    }
    *(long *)this = *(long *)this + 1;
  }
  else {
    detail::timed_mutex_impl::impl_lock((timed_mutex_impl *)(this + 0x10),&local_20);
    *(undefined8 *)this = 1;
    *(pthread_t *)(this + 8) = pVar1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void lock()
  {
    const auto tid = std::this_thread::get_id();
    auto lk = impl_.internal_lock();
    if (owner_ == tid) {
      assert(0 < ncount_);
      ++ncount_;
    } else {
      impl_.impl_lock(lk);
      ncount_ = 1;
      owner_ = tid;
    }
  }